

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::PixelStoreAlignTestCase::test
          (PixelStoreAlignTestCase *this)

{
  uint param;
  int local_2c;
  int referenceValue;
  int ndx;
  int alignments [4];
  PixelStoreAlignTestCase *this_local;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,4);
  ApiCase::expectError(&this->super_ApiCase,0);
  _referenceValue = 0x200000001;
  alignments[0] = 4;
  alignments[1] = 8;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    param = (&referenceValue)[local_2c];
    glu::CallLogWrapper::glPixelStorei
              (&(this->super_ApiCase).super_CallLogWrapper,this->m_testTargetName,param);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)param);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_testTargetName, 4);
		expectError(GL_NO_ERROR);

		const int alignments[] = {1, 2, 4, 8};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(alignments); ++ndx)
		{
			const int referenceValue = alignments[ndx];

			glPixelStorei(m_testTargetName, referenceValue);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, referenceValue);
			expectError(GL_NO_ERROR);
		}
	}